

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::CompactReporter::testRunStarting(CompactReporter *this,TestRunInfo *param_1)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  ColourGuard local_20;
  
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    local_20.m_colourImpl =
         Detail::unique_ptr<Catch::ColourImpl>::operator->
                   (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    local_20.m_code = BrightYellow;
    local_20.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_20,poVar2);
    poVar2 = std::operator<<(poVar2,"Filters: ");
    iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    TestSpec::serializeTo((TestSpec *)CONCAT44(extraout_var_00,iVar1),poVar2);
    std::operator<<(poVar2,'\n');
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "RNG seed: ");
  getSeed();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void CompactReporter::testRunStarting( TestRunInfo const& ) {
            if ( m_config->testSpec().hasFilters() ) {
                m_stream << m_colour->guardColour( Colour::BrightYellow )
                         << "Filters: "
                         << m_config->testSpec()
                         << '\n';
            }
            m_stream << "RNG seed: " << getSeed() << '\n';
        }